

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O1

void logging_tests::logging_SeverityLevels_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  logging_SeverityLevels t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 local_6c0 [112];
  ios_base local_650 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined1 local_528 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [26];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_6c8 = "";
  memset((ostringstream *)local_528,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
  local_3b0[0]._M_string_length = 0;
  local_3b0[0].field_2._M_local_buf[0] = '\0';
  local_6c0[0] = (ostringstream)0x22;
  local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,local_6c0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_528,"logging_SeverityLevels",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_3b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0);
  if ((undefined1 *)CONCAT71(local_6c0._1_7_,local_6c0[0]) != local_6c0 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_6c0._1_7_,local_6c0[0]),local_6c0._16_8_ + 1);
  }
  local_6e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0[0]._M_dataplus._M_p;
  local_6d8 = local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length;
  file.m_end = (iterator)0xb9;
  file.m_begin = (iterator)&local_6d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_6e0,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
    operator_delete(local_3b0[0]._M_dataplus._M_p,
                    CONCAT71(local_3b0[0].field_2._M_allocated_capacity._1_7_,
                             local_3b0[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
  std::ios_base::~ios_base((ios_base *)(local_528 + 0x70));
  LogSetup::LogSetup((LogSetup *)local_528);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_6e8 = "";
  memset((ostringstream *)local_6c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c0);
  paVar1 = &local_548.field_2;
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_548._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6c0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6c0,"logging_SeverityLevels",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6c0,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_548,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_700 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p;
  local_6f8 = local_548._M_dataplus._M_p + local_548._M_string_length;
  file_00.m_end = (iterator)0xb9;
  file_00.m_begin = (iterator)&local_6f0;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_700,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar1) {
    operator_delete(local_548._M_dataplus._M_p,
                    CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                             local_548.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c0);
  std::ios_base::~ios_base(local_650);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_708 = "";
  memset((ostringstream *)local_6c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c0);
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_548._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6c0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6c0,"logging_SeverityLevels",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6c0,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_548,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_720 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p;
  local_718 = local_548._M_dataplus._M_p + local_548._M_string_length;
  file_01.m_end = (iterator)0xb9;
  file_01.m_begin = (iterator)&local_710;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_720,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar1) {
    operator_delete(local_548._M_dataplus._M_p,
                    CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                             local_548.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c0);
  std::ios_base::~ios_base(local_650);
  logging_SeverityLevels::test_method((logging_SeverityLevels *)local_528);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_730 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_728 = "";
  memset((ostringstream *)local_6c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c0);
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_548._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6c0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6c0,"logging_SeverityLevels",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6c0,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_548,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_740 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p;
  local_738 = local_548._M_dataplus._M_p + local_548._M_string_length;
  file_02.m_end = (iterator)0xb9;
  file_02.m_begin = (iterator)&local_730;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_740,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar1) {
    operator_delete(local_548._M_dataplus._M_p,
                    CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                             local_548.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c0);
  std::ios_base::~ios_base(local_650);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_748 = "";
  memset((ostringstream *)local_6c0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c0);
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_548._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6c0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6c0,"logging_SeverityLevels",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6c0,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_548,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_760 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p;
  local_758 = local_548._M_dataplus._M_p + local_548._M_string_length;
  file_03.m_end = (iterator)0xb9;
  file_03.m_begin = (iterator)&local_750;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_760,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar1) {
    operator_delete(local_548._M_dataplus._M_p,
                    CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                             local_548.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c0);
  std::ios_base::~ios_base(local_650);
  LogSetup::~LogSetup((LogSetup *)local_528);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_SeverityLevels, LogSetup)
{
    LogInstance().EnableCategory(BCLog::LogFlags::ALL);

    LogInstance().SetLogLevel(BCLog::Level::Debug);
    LogInstance().SetCategoryLogLevel(/*category_str=*/"net", /*level_str=*/"info");

    // Global log level
    LogPrintLevel(BCLog::HTTP, BCLog::Level::Info, "foo1: %s\n", "bar1");
    LogPrintLevel(BCLog::MEMPOOL, BCLog::Level::Trace, "foo2: %s. This log level is lower than the global one.\n", "bar2");
    LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Warning, "foo3: %s\n", "bar3");
    LogPrintLevel(BCLog::RPC, BCLog::Level::Error, "foo4: %s\n", "bar4");

    // Category-specific log level
    LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "foo5: %s\n", "bar5");
    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "foo6: %s. This log level is the same as the global one but lower than the category-specific one, which takes precedence. \n", "bar6");
    LogPrintLevel(BCLog::NET, BCLog::Level::Error, "foo7: %s\n", "bar7");

    std::vector<std::string> expected = {
        "[http:info] foo1: bar1",
        "[validation:warning] foo3: bar3",
        "[rpc:error] foo4: bar4",
        "[net:warning] foo5: bar5",
        "[net:error] foo7: bar7",
    };
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}